

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

bool __thiscall mjs::gc_heap::gc_state::initial_state(gc_state *this)

{
  bool bVar1;
  bool local_11;
  gc_state *this_local;
  
  local_11 = false;
  if ((this->level == 0) && (local_11 = false, this->new_context == (allocation_context *)0x0)) {
    bVar1 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::empty
                      (&this->pending_fixups);
    local_11 = false;
    if (bVar1) {
      local_11 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::empty
                           (&this->weak_fixups);
    }
  }
  return local_11;
}

Assistant:

bool initial_state() const { return level == 0 && new_context == nullptr && pending_fixups.empty() && weak_fixups.empty(); }